

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void clog::concurrentFunc(void)

{
  size_t sVar1;
  uint uVar2;
  type str;
  size_type *local_70;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (_runing == '\x01') {
    do {
      BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::take(&local_50,
             (BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)queue_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        uStack_58 = local_50.field_2._8_8_;
        local_70 = &local_60;
      }
      else {
        local_70 = (size_type *)local_50._M_dataplus._M_p;
      }
      local_60 = local_50.field_2._M_allocated_capacity;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logStream,(char *)local_70,local_50._M_string_length);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
    } while (_runing != '\0');
  }
  sVar1 = BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)queue_abi_cxx11_);
  if (0 < (int)sVar1) {
    do {
      BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::take(&local_50,
             (BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)queue_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        uStack_58 = local_50.field_2._8_8_;
        local_70 = &local_60;
      }
      else {
        local_70 = (size_type *)local_50._M_dataplus._M_p;
      }
      local_60 = local_50.field_2._M_allocated_capacity;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logStream,(char *)local_70,local_50._M_string_length);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      uVar2 = (int)sVar1 - 1;
      sVar1 = (size_t)uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void concurrentFunc()  // 多线程场景下单独使用一个线程来写日志
{
    while (_runing)
    {
        auto str(std::move(queue.take()));
        defaultOutput(str);
    }

    int size;

    if((size = queue.size()) != 0)
    {
        for (int i=0; i<size; ++i)
        {
            auto str(std::move(queue.take()));
            defaultOutput(str);
        }
    }
}